

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildKey.h
# Opt level: O2

Kind llbuild::buildsystem::BuildKey::kindForIdentifier(char identifier)

{
  Kind KVar1;
  undefined3 in_register_00000039;
  int iVar2;
  
  iVar2 = CONCAT31(in_register_00000039,identifier);
  if (iVar2 != 0x43) {
    if (iVar2 == 0x73) {
      KVar1 = DirectoryTreeStructureSignature;
    }
    else if (iVar2 == 0x49) {
      KVar1 = Stat;
    }
    else if (iVar2 == 0x4e) {
      KVar1 = Node;
    }
    else if (iVar2 == 0x53) {
      KVar1 = DirectoryTreeSignature;
    }
    else if (iVar2 == 0x54) {
      KVar1 = Target;
    }
    else if (iVar2 == 0x58) {
      KVar1 = CustomTask;
    }
    else if (iVar2 == 100) {
      KVar1 = FilteredDirectoryContents;
    }
    else if (iVar2 == 0x44) {
      KVar1 = DirectoryContents;
    }
    else {
      KVar1 = Unknown;
    }
    return KVar1;
  }
  return Command;
}

Assistant:

static Kind kindForIdentifier(char identifier) {
    switch (identifier) {
    case 'C': return Kind::Command;
    case 'D': return Kind::DirectoryContents;
    case 'd': return Kind::FilteredDirectoryContents;
    case 'N': return Kind::Node;
    case 'I': return Kind::Stat;
    case 'S': return Kind::DirectoryTreeSignature;
    case 's': return Kind::DirectoryTreeStructureSignature;
    case 'T': return Kind::Target;
    case 'X': return Kind::CustomTask;
    default:
      return Kind::Unknown;
    }
  }